

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O1

void __thiscall
icu_63::UTF16CollationIterator::forwardNumCodePoints
          (UTF16CollationIterator *this,int32_t num,UErrorCode *param_2)

{
  UChar UVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  bool bVar5;
  
  pUVar3 = this->pos;
  pUVar4 = this->limit;
  while( true ) {
    if (num < 1) {
      return;
    }
    if (pUVar3 == pUVar4) break;
    UVar1 = *pUVar3;
    bVar5 = pUVar4 == (UChar *)0x0;
    if (bVar5 && UVar1 == L'\0') {
      this->limit = pUVar3;
      pUVar4 = pUVar3;
      pUVar2 = pUVar3;
    }
    else {
      pUVar2 = pUVar3 + 1;
      this->pos = pUVar2;
      num = num + -1;
      if ((pUVar2 != pUVar4 && (UVar1 & 0xfc00U) == 0xd800) && ((*pUVar2 & 0xfc00U) == 0xdc00)) {
        this->pos = pUVar3 + 2;
        pUVar2 = pUVar3 + 2;
      }
    }
    pUVar3 = pUVar2;
    if (bVar5 && UVar1 == L'\0') {
      return;
    }
  }
  return;
}

Assistant:

void
UTF16CollationIterator::forwardNumCodePoints(int32_t num, UErrorCode & /*errorCode*/) {
    while(num > 0 && pos != limit) {
        UChar32 c = *pos;
        if(c == 0 && limit == NULL) {
            limit = pos;
            break;
        }
        ++pos;
        --num;
        if(U16_IS_LEAD(c) && pos != limit && U16_IS_TRAIL(*pos)) {
            ++pos;
        }
    }
}